

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void response_close_frame_written
               (cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  undefined8 *puVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  undefined8 uVar5;
  
  puVar1 = *(undefined8 **)((long)handler_context + 0x218);
  if (puVar1 != (undefined8 *)0x0) {
    if (puVar1 == *(undefined8 **)((long)handler_context + 0x220)) {
      uVar5 = 0;
    }
    else {
      uVar5 = *puVar1;
    }
    *(undefined8 *)((long)handler_context + 0x218) = uVar5;
  }
  plVar2 = (long *)puVar1[1];
  plVar3 = (long *)*plVar2;
  if (plVar3 != (long *)0x0 && plVar3 != plVar2) {
    plVar2[2] = plVar2[2] + -1;
    plVar2[3] = plVar2[3] - plVar3[3];
    lVar4 = *plVar3;
    plVar2 = (long *)plVar3[1];
    *(long **)(lVar4 + 8) = plVar2;
    *plVar2 = lVar4;
  }
  puVar1[1] = 0;
  abort_write_jobs((cio_websocket *)handler_context);
  close((int)handler_context);
  return;
}

Assistant:

static void response_close_frame_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	(void)err;

	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	write_jobs_popfront(websocket);

	abort_write_jobs(websocket);
	close(websocket);
}